

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

void __thiscall
blockencodings_tests::TransactionsRequestDeserializationMaxTest::test_method
          (TransactionsRequestDeserializationMaxTest *this)

{
  bool bVar1;
  reference pvVar2;
  long in_FS_OFFSET;
  DataStream stream;
  BlockTransactionsRequest req1;
  BlockTransactionsRequest req0;
  char *in_stack_fffffffffffffdf8;
  BlockTransactionsRequest *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  size_type in_stack_fffffffffffffe10;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffe28;
  const_string *in_stack_fffffffffffffe30;
  lazy_ostream *in_stack_fffffffffffffe38;
  undefined1 local_178 [16];
  undefined1 local_168 [64];
  BlockTransactionsRequest local_128;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  BlockTransactionsRequest::BlockTransactionsRequest
            ((BlockTransactionsRequest *)in_stack_fffffffffffffdf8);
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffffe28);
  local_38 = local_58;
  uStack_30 = uStack_50;
  local_48 = local_68;
  uStack_40 = uStack_60;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                      in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
  *pvVar2 = 0xffff;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffdf8);
  DataStream::operator<<((DataStream *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  BlockTransactionsRequest::BlockTransactionsRequest
            ((BlockTransactionsRequest *)in_stack_fffffffffffffdf8);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               (size_t)in_stack_fffffffffffffe28,
               (const_string *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe00,(char (*) [1])in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    local_128.blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffdf8);
    local_128.blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe08 = "req1.indexes.size()";
    in_stack_fffffffffffffe00 = &local_128;
    in_stack_fffffffffffffdf8 = "req0.indexes.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_128.indexes,local_128.blockhash.super_base_blob<256U>.m_data._M_elems + 0x10,
               0x187,1,2,local_128.blockhash.super_base_blob<256U>.m_data._M_elems + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               (size_t)in_stack_fffffffffffffe28,
               (const_string *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    in_stack_fffffffffffffe38 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe00,(char (*) [1])in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe28 = (RandomMixin<FastRandomContext> *)0x0;
    in_stack_fffffffffffffe30 =
         (const_string *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
    in_stack_fffffffffffffe00 =
         (BlockTransactionsRequest *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
    in_stack_fffffffffffffe08 = "req1.indexes[0]";
    in_stack_fffffffffffffdf8 = "req0.indexes[0]";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
              (local_168,local_178,0x188,1,2,in_stack_fffffffffffffe30);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe27);
  BlockTransactionsRequest::~BlockTransactionsRequest
            ((BlockTransactionsRequest *)in_stack_fffffffffffffdf8);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffdf8);
  BlockTransactionsRequest::~BlockTransactionsRequest
            ((BlockTransactionsRequest *)in_stack_fffffffffffffdf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(TransactionsRequestDeserializationMaxTest) {
    // Check that the highest legal index is decoded correctly
    BlockTransactionsRequest req0;
    req0.blockhash = m_rng.rand256();
    req0.indexes.resize(1);
    req0.indexes[0] = 0xffff;
    DataStream stream{};
    stream << req0;

    BlockTransactionsRequest req1;
    stream >> req1;
    BOOST_CHECK_EQUAL(req0.indexes.size(), req1.indexes.size());
    BOOST_CHECK_EQUAL(req0.indexes[0], req1.indexes[0]);
}